

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O3

MultiIndexSet *
TasGrid::makeSequenceSet
          (MultiIndexSet *__return_storage_ptr__,int cnum_dimensions,int depth,TypeDepth type,
          TypeOneDRule crule,vector<int,_std::allocator<int>_> *anisotropic_weights,
          vector<int,_std::allocator<int>_> *level_limits)

{
  TypeOneDRule local_4c;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_4c = crule;
  if ((type < (type_qptensor|type_level)) && ((0x12a0U >> (type & 0x1f) & 1) != 0)) {
    local_28._8_8_ = 0;
    local_28._M_unused._M_object = &local_4c;
    local_10 = std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridSequence.cpp:64:48)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridSequence.cpp:64:48)>
               ::_M_manager;
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,(long)cnum_dimensions,depth,type,
               (function<int_(int)> *)&local_28,anisotropic_weights,level_limits);
    if (local_18 != (code *)0x0) {
      (*local_18)((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
    }
  }
  else {
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridSequence.cpp:67:48)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridSequence.cpp:67:48)>
               ::_M_manager;
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,(long)cnum_dimensions,depth,type,
               (function<int_(int)> *)&local_48,anisotropic_weights,level_limits);
    if (local_38 != (code *)0x0) {
      (*local_38)((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline MultiIndexSet makeSequenceSet(int cnum_dimensions, int depth, TypeDepth type, TypeOneDRule crule,
                                     const std::vector<int> &anisotropic_weights, const std::vector<int> &level_limits){
    return (OneDimensionalMeta::isExactQuadrature(type)) ?
        MultiIndexManipulations::selectTensors((size_t) cnum_dimensions, depth, type,
                                               [&](int i) -> int{ return OneDimensionalMeta::getQExact(i, crule); },
                                               anisotropic_weights, level_limits) :
        MultiIndexManipulations::selectTensors((size_t) cnum_dimensions, depth, type,
                                               [&](int i) -> int{ return i; }, anisotropic_weights, level_limits);
}